

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

StratifiedSampler * __thiscall
pbrt::StratifiedSampler::Create
          (StratifiedSampler *this,ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  StratifiedSampler *pSVar3;
  int iVar4;
  undefined8 in_XMM0_Qa;
  double dVar5;
  undefined1 auVar6 [16];
  int ySamples;
  int xSamples;
  int va;
  undefined4 uStack_54;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  int vb;
  
  _va = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&va,"jitter","");
  bVar1 = ParameterDictionary::GetOneBool((ParameterDictionary *)this,(string *)&va,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_va != &local_48) {
    operator_delete(_va,CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
    ;
  }
  _va = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&va,"xsamples","");
  xSamples = ParameterDictionary::GetOneInt((ParameterDictionary *)this,(string *)&va,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_va != &local_48) {
    operator_delete(_va,CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
    ;
  }
  _va = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&va,"ysamples","");
  ySamples = ParameterDictionary::GetOneInt((ParameterDictionary *)this,(string *)&va,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_va != &local_48) {
    operator_delete(_va,CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
    ;
  }
  if ((char)Options[8] == '\x01') {
    iVar2 = Options[7];
    auVar6._0_8_ = (double)iVar2;
    auVar6._8_8_ = in_XMM0_Qa;
    if (auVar6._0_8_ < 0.0) {
      dVar5 = sqrt(auVar6._0_8_);
    }
    else {
      auVar6 = vsqrtsd_avx(auVar6,auVar6);
      dVar5 = auVar6._0_8_;
    }
    for (iVar4 = (int)dVar5; iVar2 % iVar4 != 0; iVar4 = iVar4 + -1) {
      va = iVar4;
      vb = 0;
      if (iVar4 < 1) {
        LogFatal<char_const(&)[4],char_const(&)[2],char_const(&)[4],int&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                   ,0x168,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])0x5836a8,
                   (char (*) [2])0x5859ee,(char (*) [4])0x5836a8,&va,(char (*) [2])0x5859ee,&vb);
      }
    }
    xSamples = iVar2 / iVar4;
    ySamples = iVar2 / xSamples;
    va = iVar2;
    vb = ySamples * xSamples;
    if (iVar2 != vb) {
      LogFatal<char_const(&)[9],char_const(&)[20],char_const(&)[9],int&,char_const(&)[20],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                 ,0x16d,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])0x567b4b,
                 (char (*) [20])"xSamples * ySamples",(char (*) [9])0x567b4b,&va,
                 (char (*) [20])"xSamples * ySamples",&vb);
    }
    if (LOGGING_LogLevel < 1) {
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      _va = (pointer)&local_48;
      detail::stringPrintfRecursive<int&,int&>
                ((string *)&va,"xSamples %d ySamples %d",&xSamples,&ySamples);
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
          ,0x16e,_va);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_va != &local_48) {
        operator_delete(_va,CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0])
                            + 1);
      }
    }
  }
  if ((char)Options[0xb] == '\x01') {
    ySamples = 1;
    xSamples = 1;
  }
  _va = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&va,"seed","");
  iVar2 = ParameterDictionary::GetOneInt((ParameterDictionary *)this,(string *)&va,*Options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_va != &local_48) {
    operator_delete(_va,CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
    ;
  }
  pSVar3 = (StratifiedSampler *)(**(code **)((loc->filename)._M_len + 0x10))(loc,0x30,8);
  pSVar3->xPixelSamples = xSamples;
  pSVar3->yPixelSamples = ySamples;
  pSVar3->seed = iVar2;
  pSVar3->jitter = bVar1;
  (pSVar3->rng).state = 0x853c49e6748fea9b;
  (pSVar3->rng).inc = 0xda3e39cb94b95bdb;
  (pSVar3->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  pSVar3->sampleIndex = 0;
  pSVar3->dimension = 0;
  return pSVar3;
}

Assistant:

StratifiedSampler *StratifiedSampler::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    bool jitter = parameters.GetOneBool("jitter", true);
    int xSamples = parameters.GetOneInt("xsamples", 4);
    int ySamples = parameters.GetOneInt("ysamples", 4);
    if (Options->pixelSamples) {
        int nSamples = *Options->pixelSamples;
        int div = std::sqrt(nSamples);
        while (nSamples % div) {
            CHECK_GT(div, 0);
            --div;
        }
        xSamples = nSamples / div;
        ySamples = nSamples / xSamples;
        CHECK_EQ(nSamples, xSamples * ySamples);
        LOG_VERBOSE("xSamples %d ySamples %d", xSamples, ySamples);
    }
    if (Options->quickRender)
        xSamples = ySamples = 1;
    int seed = parameters.GetOneInt("seed", Options->seed);

    return alloc.new_object<StratifiedSampler>(xSamples, ySamples, jitter, seed);
}